

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
glcts::LayoutBindingBaseCase::makeSparseRange
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,LayoutBindingBaseCase *this,
          int maxElement,int minElement)

{
  float fVar1;
  undefined4 in_register_00000014;
  pointer pfVar2;
  vector<float,_std::allocator<float>_> rangeTemplate;
  int local_3c;
  _Vector_base<float,_std::allocator<float>_> local_38;
  
  makeVector<float,6ul>
            ((vector<float,_std::allocator<float>_> *)&local_38,(glcts *)makeSparseRange::rangeT,
             (float (*) [6])CONCAT44(in_register_00000014,maxElement));
  fVar1 = local_38._M_impl.super__Vector_impl_data._M_finish[-1];
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pfVar2 = local_38._M_impl.super__Vector_impl_data._M_start;
      pfVar2 != local_38._M_impl.super__Vector_impl_data._M_finish; pfVar2 = pfVar2 + 1) {
    local_3c = (int)((*pfVar2 * (float)(~minElement + maxElement)) / fVar1) + minElement;
    std::vector<int,_std::allocator<int>_>::_M_insert_rval
              (__return_storage_ptr__,
               (const_iterator)
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish,&local_3c);
  }
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> makeSparseRange(int maxElement, int minElement = 0) const
	{
		static float	   rangeT[]		 = { 0.0f, 0.1f, 0.5f, 0.6f, 0.9f, 1.0f };
		std::vector<float> rangeTemplate = makeVector(rangeT);
		float			   max			 = rangeTemplate.back();
		float			   range		 = (float)((maxElement - 1) - minElement);

		std::vector<int> result;
		for (std::vector<float>::iterator it = rangeTemplate.begin(); it != rangeTemplate.end(); it++)
		{
			float e = *it;
			e		= (e * range) / max;
			result.insert(result.end(), minElement + (int)e);
		}
		return result;
	}